

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotionImposed.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotionImposed::Update(ChLinkMotionImposed *this,double mytime,bool update_assets)

{
  ChFrame<double> *this_00;
  long lVar1;
  ChFrame<double> *pCVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ChLinkMotionImposed *pCVar5;
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *pMVar6;
  Index index;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  Index size;
  Index size_1;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChMatrix33<double> Jw2;
  ChMatrix33<double> Jw1;
  ChMatrix33<double> Jr1;
  ChMatrix33<double> Jx2;
  ChMatrix33<double> Jx1;
  ChMatrix33<double> Jr2;
  ChMatrix33<double> mtempQ;
  ChFrame<double> frameMW;
  ChMatrix33<double> planeMW;
  ChFrame<double> frame2W;
  ChFrame<double> frame1W;
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_530;
  ChMatrix33<double> *local_528;
  ulong local_520;
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_510;
  double local_508;
  ulong local_500;
  ChLinkMotionImposed *local_4f8;
  DstXprType *local_4f0;
  double local_4e8;
  ChMatrix33<double> *pCStack_4e0;
  double local_4d8;
  double local_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  undefined8 local_4b8;
  double local_4b0;
  ChMatrix33<double> local_4a8;
  DstXprType local_458;
  ChMatrix33<double> local_410;
  ChMatrix33<double> local_3c8;
  ChMatrix33<double> local_380;
  ChMatrix33<double> local_338;
  ChFrame<double> local_2f0;
  ChMatrix33<double> local_268;
  ChFrame<double> local_218;
  ChQuaternion<double> local_188;
  double dStack_168;
  double dStack_160;
  double dStack_158;
  double dStack_150;
  double local_148;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  local_508 = mytime;
  ChLinkMateGeneric::Update(&this->super_ChLinkMateGeneric,mytime,update_assets);
  pCVar2 = (ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1;
  if (pCVar2 == (ChFrame<double> *)0x0) {
    return;
  }
  if ((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2 == (ChBodyFrame *)0x0) {
    return;
  }
  ChFrame<double>::operator>>(&local_b8,&(this->super_ChLinkMateGeneric).frame1,pCVar2);
  pCVar2 = &(this->super_ChLinkMateGeneric).frame2;
  ChFrame<double>::operator>>
            (&local_140,pCVar2,
             (ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2)
  ;
  this_00 = &this->frameM2;
  (*((this->rotation_function).
     super___shared_ptr<chrono::ChFunctionRotation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunctionRotation[3])(local_508,&local_218);
  ChFrame<double>::SetRot(this_00,(ChQuaternion<double> *)&local_218);
  (*((this->position_function).
     super___shared_ptr<chrono::ChFunctionPosition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunctionPosition[3])(&local_218);
  if ((ChFrame<double> *)&(this->frameM2).coord != &local_218) {
    (this->frameM2).coord.pos.m_data[0] = (double)local_218._vptr_ChFrame;
    (this->frameM2).coord.pos.m_data[1] = local_218.coord.pos.m_data[0];
    (this->frameM2).coord.pos.m_data[2] = local_218.coord.pos.m_data[1];
  }
  ChFrame<double>::operator>>(&local_218,this_00,pCVar2);
  ChFrame<double>::operator=(&this->frameMb2,&local_218);
  ChFrame<double>::operator>>(&local_218,this_00,&local_140);
  local_188.m_data[0] = 1.0;
  local_188.m_data[1] = 0.0;
  local_188.m_data[2] = 0.0;
  local_188.m_data[3] = 0.0;
  local_2f0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_2f0.coord.pos.m_data[0] = 0.0;
  local_2f0.coord.pos.m_data[1] = 0.0;
  local_2f0.coord.pos.m_data[2] = 0.0;
  local_2f0.coord.rot.m_data[0] = 1.0;
  local_2f0.coord.rot.m_data[1] = 0.0;
  local_2f0.coord.rot.m_data[2] = 0.0;
  local_2f0.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_2f0.Amatrix,&local_188);
  ChFrame<double>::TransformParentToLocal(&local_218,&local_b8,&local_2f0);
  local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_4a8;
  local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_3c8;
  local_148 = local_218.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
  ;
  local_188.m_data[0] =
       local_218.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_188.m_data[1] =
       local_218.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_188.m_data[2] =
       local_218.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_188.m_data[3] =
       local_218.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dStack_168 = local_218.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  dStack_160 = local_218.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  dStack_158 = local_218.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
  dStack_150 = local_218.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&(((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_410;
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_188;
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_188;
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_3c8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_458;
  local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (double)&local_458;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)&local_380);
  local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&(((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_188;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_4a8,
             (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_380);
  local_3c8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_188;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_380,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_3c8);
  local_410.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_188;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>>
            (&local_3c8,
             (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_410);
  pCStack_4e0 = &local_338;
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[2];
  auVar16._0_8_ =
       -local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar16._8_8_ = 0x8000000000000000;
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)vmovlpd_avx(auVar16);
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  auVar15 = *(undefined1 (*) [16])(this->super_ChLinkMateGeneric).frame1.coord.pos.m_data;
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[1];
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       -auVar15._0_8_;
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       -auVar15._8_8_;
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)vmovlpd_avx(auVar15);
  local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  local_4f0 = &local_458;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_410,
             (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_4f0);
  local_4f0 = (DstXprType *)0x0;
  local_4d8 = (this->frameMb2).coord.pos.m_data[2];
  auVar17._0_8_ = -local_4d8;
  auVar17._8_8_ = 0x8000000000000000;
  local_4e8 = (double)vmovlpd_avx(auVar17);
  local_4d0 = 0.0;
  auVar15 = *(undefined1 (*) [16])(this->frameMb2).coord.pos.m_data;
  pCStack_4e0 = (ChMatrix33<double> *)(this->frameMb2).coord.pos.m_data[1];
  local_4c8 = auVar15._0_8_ ^ 0x8000000000000000;
  uStack_4c0 = auVar15._8_8_ ^ 0x8000000000000000;
  local_4b8 = vmovlpd_avx(auVar15);
  local_4b0 = 0.0;
  local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_4a8;
  local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)&local_4f0;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_338,
             (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_268);
  auVar3._8_8_ = local_2f0.coord.rot.m_data[2];
  auVar3._0_8_ = local_2f0.coord.rot.m_data[1];
  local_4d8 = local_2f0.coord.rot.m_data[3] * 0.5;
  auVar15._8_8_ = 0x3fe0000000000000;
  auVar15._0_8_ = 0x3fe0000000000000;
  auVar15 = vmulpd_avx512vl(auVar3,auVar15);
  local_4f0 = (DstXprType *)(local_2f0.coord.rot.m_data[0] * 0.5);
  local_4e8 = -local_4d8;
  pCStack_4e0 = auVar15._8_8_;
  local_4c8 = auVar15._0_8_ ^ 0x8000000000000000;
  uStack_4c0 = (ulong)pCStack_4e0 ^ 0x8000000000000000;
  local_4b8 = vmovlpd_avx(auVar15);
  local_530 = (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
               *)&local_4f0;
  local_528 = (ChMatrix33<double> *)&local_458;
  local_4d0 = (double)local_4f0;
  local_4b0 = (double)local_4f0;
  ChMatrix33<double>::operator=
            (&local_268,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_530);
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_530 = (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
               *)&local_4f0;
  local_528 = &local_4a8;
  ChMatrix33<double>::operator=
            (&local_268,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_530);
  uVar8 = 0;
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_268.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  if ((this->super_ChLinkMateGeneric).c_x == true) {
    if ((this->super_ChLinkMateGeneric).C.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows < 1)
    goto LAB_005c1c27;
    (this->super_ChLinkMateGeneric).C.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
    m_storage.m_data.array[0] = local_2f0.coord.pos.m_data[0];
    if ((this->super_ChLinkMateGeneric).mask.nconstr < 1) goto LAB_005c1be6;
    (**(code **)((long)((*(this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    if ((long)local_520 < 3) goto LAB_005c1c08;
    uVar7 = 3;
    if (((ulong)local_530 & 7) == 0) {
      uVar8 = -((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar8 < 3) {
        uVar7 = (ulong)uVar8;
      }
      if (uVar8 != 0) goto LAB_005c0afb;
    }
    else {
LAB_005c0afb:
      uVar10 = 0;
      do {
        *(double *)(local_530 + uVar10 * 8) =
             local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    if (uVar7 < 3) {
      do {
        *(double *)(local_530 + uVar7 * 8) =
             local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr < 1) goto LAB_005c1be6;
    (**(code **)((long)((*(this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar7 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar8 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar8 < 3) {
        uVar7 = (ulong)uVar8;
      }
      if (uVar8 != 0) goto LAB_005c0b89;
    }
    else {
LAB_005c0b89:
      uVar10 = 0;
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_410.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    if (uVar7 < 3) {
      do {
        *(double *)(pMVar6 + uVar7 * 8) =
             local_410.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr < 1) goto LAB_005c1be6;
    (**(code **)((long)((*(this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    if ((long)local_520 < 3) goto LAB_005c1c08;
    uVar7 = 3;
    if (((ulong)local_530 & 7) == 0) {
      uVar8 = -((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar8 < 3) {
        uVar7 = (ulong)uVar8;
      }
      if (uVar8 != 0) goto LAB_005c0c13;
    }
    else {
LAB_005c0c13:
      uVar10 = 0;
      do {
        *(double *)(local_530 + uVar10 * 8) =
             local_3c8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    if (uVar7 < 3) {
      do {
        *(double *)(local_530 + uVar7 * 8) =
             local_3c8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr < 1) goto LAB_005c1be6;
    (**(code **)((long)((*(this->super_ChLinkMateGeneric).mask.constraints.
                          super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar7 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar8 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar8 < 3) {
        uVar7 = (ulong)uVar8;
      }
      if (uVar8 != 0) goto LAB_005c0ca1;
    }
    else {
LAB_005c0ca1:
      uVar10 = 0;
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    if (uVar7 < 3) {
      do {
        *(double *)(pMVar6 + uVar7 * 8) =
             local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
    }
    uVar8 = 1;
  }
  if ((this->super_ChLinkMateGeneric).c_y == true) {
    uVar7 = (ulong)uVar8;
    if ((this->super_ChLinkMateGeneric).C.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
        (long)uVar7) goto LAB_005c1c27;
    (this->super_ChLinkMateGeneric).C.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
    m_storage.m_data.array[uVar7] = local_2f0.coord.pos.m_data[1];
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    if ((long)local_520 < 3) goto LAB_005c1c08;
    uVar10 = 3;
    if (((ulong)local_530 & 7) == 0) {
      uVar9 = -((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar9 < 3) {
        uVar10 = (ulong)uVar9;
      }
      if (uVar9 != 0) goto LAB_005c0d63;
    }
    else {
LAB_005c0d63:
      uVar11 = 0;
      do {
        *(double *)(local_530 + uVar11 * 8) =
             local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar11 + 3];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (uVar10 < 3) {
      do {
        *(double *)(local_530 + uVar10 * 8) =
             local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10 + 3];
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar10 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar9 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar9 < 3) {
        uVar10 = (ulong)uVar9;
      }
      if (uVar9 != 0) goto LAB_005c0df1;
    }
    else {
LAB_005c0df1:
      uVar11 = 0;
      do {
        *(double *)(pMVar6 + uVar11 * 8) =
             local_410.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar11 + 3];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (uVar10 < 3) {
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_410.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10 + 3];
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    if ((long)local_520 < 3) goto LAB_005c1c08;
    uVar10 = 3;
    if (((ulong)local_530 & 7) == 0) {
      uVar9 = -((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar9 < 3) {
        uVar10 = (ulong)uVar9;
      }
      if (uVar9 != 0) goto LAB_005c0e7b;
    }
    else {
LAB_005c0e7b:
      uVar11 = 0;
      do {
        *(double *)(local_530 + uVar11 * 8) =
             local_3c8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar11 + 3];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (uVar10 < 3) {
      do {
        *(double *)(local_530 + uVar10 * 8) =
             local_3c8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10 + 3];
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar7 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar9 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar9 < 3) {
        uVar7 = (ulong)uVar9;
      }
      if (uVar9 != 0) goto LAB_005c0f09;
    }
    else {
LAB_005c0f09:
      uVar10 = 0;
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10 + 3];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    if (uVar7 < 3) {
      do {
        *(double *)(pMVar6 + uVar7 * 8) =
             local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar7 + 3];
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
    }
    uVar8 = uVar8 + 1;
  }
  if ((this->super_ChLinkMateGeneric).c_z == true) {
    uVar7 = (ulong)uVar8;
    if ((this->super_ChLinkMateGeneric).C.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
        (long)uVar7) goto LAB_005c1c27;
    (this->super_ChLinkMateGeneric).C.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
    m_storage.m_data.array[uVar7] = local_2f0.coord.pos.m_data[2];
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    if ((long)local_520 < 3) goto LAB_005c1c08;
    uVar10 = 3;
    if (((ulong)local_530 & 7) == 0) {
      uVar9 = -((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar9 < 3) {
        uVar10 = (ulong)uVar9;
      }
      if (uVar9 != 0) goto LAB_005c0fc8;
    }
    else {
LAB_005c0fc8:
      uVar11 = 0;
      do {
        *(double *)(local_530 + uVar11 * 8) =
             local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar11 + 6];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (uVar10 < 3) {
      do {
        *(double *)(local_530 + uVar10 * 8) =
             local_380.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10 + 6];
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar10 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar9 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar9 < 3) {
        uVar10 = (ulong)uVar9;
      }
      if (uVar9 != 0) goto LAB_005c1056;
    }
    else {
LAB_005c1056:
      uVar11 = 0;
      do {
        *(double *)(pMVar6 + uVar11 * 8) =
             local_410.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar11 + 6];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (uVar10 < 3) {
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_410.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10 + 6];
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    if ((long)local_520 < 3) goto LAB_005c1c08;
    uVar10 = 3;
    if (((ulong)local_530 & 7) == 0) {
      uVar9 = -((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar9 < 3) {
        uVar10 = (ulong)uVar9;
      }
      if (uVar9 != 0) goto LAB_005c10e0;
    }
    else {
LAB_005c10e0:
      uVar11 = 0;
      do {
        *(double *)(local_530 + uVar11 * 8) =
             local_3c8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar11 + 6];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (uVar10 < 3) {
      do {
        *(double *)(local_530 + uVar10 * 8) =
             local_3c8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10 + 6];
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar7 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar9 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar9 < 3) {
        uVar7 = (ulong)uVar9;
      }
      if (uVar9 != 0) goto LAB_005c116e;
    }
    else {
LAB_005c116e:
      uVar10 = 0;
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10 + 6];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    if (uVar7 < 3) {
      do {
        *(double *)(pMVar6 + uVar7 * 8) =
             local_338.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar7 + 6];
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
    }
    uVar8 = uVar8 + 1;
  }
  local_4f8 = this;
  if ((this->super_ChLinkMateGeneric).c_rx == true) {
    uVar7 = (ulong)uVar8;
    if ((this->super_ChLinkMateGeneric).C.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <=
        (long)uVar7) goto LAB_005c1c27;
    (this->super_ChLinkMateGeneric).C.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
    m_storage.m_data.array[uVar7] = local_2f0.coord.rot.m_data[1];
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    uVar10 = local_520;
    pMVar6 = local_530;
    if ((long)local_520 < 0) goto LAB_005c1c49;
    local_508 = (double)CONCAT44(local_508._4_4_,uVar8);
    uVar11 = local_520;
    if ((((ulong)local_530 & 7) == 0) &&
       (uVar11 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), local_520 <= uVar11)) {
      uVar11 = local_520;
    }
    uVar13 = local_520 - uVar11;
    uVar14 = uVar13 + 7;
    if (-1 < (long)uVar13) {
      uVar14 = uVar13;
    }
    local_500 = uVar7;
    if (uVar11 != 0) {
      memset(local_530,0,uVar11 * 8);
    }
    lVar1 = (uVar14 & 0xfffffffffffffff8) + uVar11;
    if (7 < (long)uVar13) {
      local_510 = pMVar6;
      lVar12 = uVar11 + 8;
      if ((long)(uVar11 + 8) < lVar1) {
        lVar12 = lVar1;
      }
      memset(pMVar6 + uVar11 * 8,0,(~uVar11 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
      pMVar6 = local_510;
    }
    if (lVar1 < (long)uVar10) {
      memset(pMVar6 + uVar11 * 8 + ((long)uVar14 >> 3) * 0x40,0,((long)uVar13 % 8) * 8);
    }
    if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005c1be6;
    (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_500]->super_ChConstraintTwo)
                       .super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    uVar7 = local_520;
    pMVar6 = local_530;
    if ((long)local_520 < 0) goto LAB_005c1c49;
    uVar10 = local_520;
    if ((((ulong)local_530 & 7) == 0) &&
       (uVar10 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), local_520 <= uVar10)) {
      uVar10 = local_520;
    }
    uVar14 = local_520 - uVar10;
    uVar11 = uVar14 + 7;
    if (-1 < (long)uVar14) {
      uVar11 = uVar14;
    }
    if (uVar10 != 0) {
      memset(local_530,0,uVar10 * 8);
    }
    lVar1 = (uVar11 & 0xfffffffffffffff8) + uVar10;
    if (7 < (long)uVar14) {
      local_510 = pMVar6;
      lVar12 = uVar10 + 8;
      if ((long)(uVar10 + 8) < lVar1) {
        lVar12 = lVar1;
      }
      memset(pMVar6 + uVar10 * 8,0,(~uVar10 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
      pMVar6 = local_510;
    }
    if (lVar1 < (long)uVar7) {
      memset(pMVar6 + uVar10 * 8 + ((long)uVar11 >> 3) * 0x40,0,((long)uVar14 % 8) * 8);
    }
    this = local_4f8;
    uVar7 = local_500;
    iVar4 = local_508._0_4_;
    if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005c1be6;
    (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_500]->super_ChConstraintTwo)
                       .super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar10 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar8 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar8 < 3) {
        uVar10 = (ulong)uVar8;
      }
      if (uVar8 != 0) goto LAB_005c1448;
    }
    else {
LAB_005c1448:
      uVar11 = 0;
      do {
        *(double *)(pMVar6 + uVar11 * 8) =
             local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (uVar10 < 3) {
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= iVar4) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar7 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar8 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar8 < 3) {
        uVar7 = (ulong)uVar8;
      }
      if (uVar8 != 0) goto LAB_005c14d6;
    }
    else {
LAB_005c14d6:
      uVar10 = 0;
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    if (uVar7 < 3) {
      do {
        *(double *)(pMVar6 + uVar7 * 8) =
             local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
    }
    uVar8 = iVar4 + 1;
  }
  if ((this->super_ChLinkMateGeneric).c_ry == true) {
    if (((int)uVar8 < 0) ||
       (uVar7 = (ulong)uVar8,
       (this->super_ChLinkMateGeneric).C.
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows <= (long)uVar7
       )) goto LAB_005c1c27;
    (this->super_ChLinkMateGeneric).C.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
    m_storage.m_data.array[uVar7] = local_2f0.coord.rot.m_data[2];
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    uVar10 = local_520;
    pMVar6 = local_530;
    if ((long)local_520 < 0) goto LAB_005c1c49;
    local_508 = (double)CONCAT44(local_508._4_4_,uVar8);
    uVar11 = local_520;
    if ((((ulong)local_530 & 7) == 0) &&
       (uVar11 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), local_520 <= uVar11)) {
      uVar11 = local_520;
    }
    uVar13 = local_520 - uVar11;
    uVar14 = uVar13 + 7;
    if (-1 < (long)uVar13) {
      uVar14 = uVar13;
    }
    local_500 = uVar7;
    if (uVar11 != 0) {
      memset(local_530,0,uVar11 * 8);
    }
    lVar1 = (uVar14 & 0xfffffffffffffff8) + uVar11;
    if (7 < (long)uVar13) {
      local_510 = pMVar6;
      lVar12 = uVar11 + 8;
      if ((long)(uVar11 + 8) < lVar1) {
        lVar12 = lVar1;
      }
      memset(pMVar6 + uVar11 * 8,0,(~uVar11 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
      pMVar6 = local_510;
    }
    if (lVar1 < (long)uVar10) {
      memset(pMVar6 + uVar11 * 8 + ((long)uVar14 >> 3) * 0x40,0,((long)uVar13 % 8) * 8);
    }
    if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005c1be6;
    (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_500]->super_ChConstraintTwo)
                       .super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    uVar7 = local_520;
    pMVar6 = local_530;
    if ((long)local_520 < 0) goto LAB_005c1c49;
    uVar10 = local_520;
    if ((((ulong)local_530 & 7) == 0) &&
       (uVar10 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), local_520 <= uVar10)) {
      uVar10 = local_520;
    }
    uVar14 = local_520 - uVar10;
    uVar11 = uVar14 + 7;
    if (-1 < (long)uVar14) {
      uVar11 = uVar14;
    }
    if (uVar10 != 0) {
      memset(local_530,0,uVar10 * 8);
    }
    lVar1 = (uVar11 & 0xfffffffffffffff8) + uVar10;
    if (7 < (long)uVar14) {
      local_510 = pMVar6;
      lVar12 = uVar10 + 8;
      if ((long)(uVar10 + 8) < lVar1) {
        lVar12 = lVar1;
      }
      memset(pMVar6 + uVar10 * 8,0,(~uVar10 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
      pMVar6 = local_510;
    }
    if (lVar1 < (long)uVar7) {
      memset(pMVar6 + uVar10 * 8 + ((long)uVar11 >> 3) * 0x40,0,((long)uVar14 % 8) * 8);
    }
    this = local_4f8;
    uVar7 = local_500;
    iVar4 = local_508._0_4_;
    if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005c1be6;
    (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_500]->super_ChConstraintTwo)
                       .super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar10 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar8 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar8 < 3) {
        uVar10 = (ulong)uVar8;
      }
      if (uVar8 != 0) goto LAB_005c17ab;
    }
    else {
LAB_005c17ab:
      uVar11 = 0;
      do {
        *(double *)(pMVar6 + uVar11 * 8) =
             local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar11 + 3];
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (uVar10 < 3) {
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[uVar10 + 3];
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    if ((this->super_ChLinkMateGeneric).mask.nconstr <= iVar4) goto LAB_005c1be6;
    (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                        super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                       super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
    if ((long)local_520 < 6) goto LAB_005c1c08;
    uVar7 = 3;
    pMVar6 = local_530 + 0x18;
    if (((ulong)pMVar6 & 7) == 0) {
      uVar8 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar8 < 3) {
        uVar7 = (ulong)uVar8;
      }
      if (uVar8 != 0) goto LAB_005c1839;
    }
    else {
LAB_005c1839:
      uVar10 = 0;
      do {
        *(double *)(pMVar6 + uVar10 * 8) =
             local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar10 + 3];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    if (uVar7 < 3) {
      do {
        *(double *)(pMVar6 + uVar7 * 8) =
             local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar7 + 3];
        uVar7 = uVar7 + 1;
      } while (uVar7 != 3);
    }
    uVar8 = iVar4 + 1;
  }
  if ((this->super_ChLinkMateGeneric).c_rz != true) {
    return;
  }
  if (((int)uVar8 < 0) ||
     (uVar7 = (ulong)uVar8,
     (this->super_ChLinkMateGeneric).C.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>
     .m_storage.m_rows <= (long)uVar7)) {
LAB_005c1c27:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1, 0, 6, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 6, 1>, Level = 1]"
                 );
  }
  (this->super_ChLinkMateGeneric).C.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.
  m_storage.m_data.array[uVar7] = local_2f0.coord.rot.m_data[3];
  if ((this->super_ChLinkMateGeneric).mask.nconstr <= (int)uVar8) goto LAB_005c1be6;
  (**(code **)((long)((this->super_ChLinkMateGeneric).mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
  uVar10 = local_520;
  pMVar6 = local_530;
  if ((long)local_520 < 0) {
LAB_005c1c49:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, 1, -1>]"
                 );
  }
  local_508 = (double)CONCAT44(local_508._4_4_,uVar8);
  uVar11 = local_520;
  if ((((ulong)local_530 & 7) == 0) &&
     (uVar11 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), local_520 <= uVar11)) {
    uVar11 = local_520;
  }
  uVar13 = local_520 - uVar11;
  uVar14 = uVar13 + 7;
  if (-1 < (long)uVar13) {
    uVar14 = uVar13;
  }
  local_500 = uVar7;
  if (uVar11 != 0) {
    memset(local_530,0,uVar11 * 8);
  }
  lVar1 = (uVar14 & 0xfffffffffffffff8) + uVar11;
  if (7 < (long)uVar13) {
    local_510 = pMVar6;
    lVar12 = uVar11 + 8;
    if ((long)(uVar11 + 8) < lVar1) {
      lVar12 = lVar1;
    }
    memset(pMVar6 + uVar11 * 8,0,(~uVar11 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
    pMVar6 = local_510;
  }
  if (lVar1 < (long)uVar10) {
    memset(pMVar6 + uVar11 * 8 + ((long)uVar14 >> 3) * 0x40,0,((long)uVar13 % 8) * 8);
  }
  if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005c1be6;
  (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_500]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
  uVar7 = local_520;
  pMVar6 = local_530;
  if ((long)local_520 < 0) goto LAB_005c1c49;
  uVar10 = local_520;
  if ((((ulong)local_530 & 7) == 0) &&
     (uVar10 = (ulong)(-((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7), local_520 <= uVar10)) {
    uVar10 = local_520;
  }
  uVar14 = local_520 - uVar10;
  uVar11 = uVar14 + 7;
  if (-1 < (long)uVar14) {
    uVar11 = uVar14;
  }
  if (uVar10 != 0) {
    memset(local_530,0,uVar10 * 8);
  }
  lVar1 = (uVar11 & 0xfffffffffffffff8) + uVar10;
  if (7 < (long)uVar14) {
    local_510 = pMVar6;
    lVar12 = uVar10 + 8;
    if ((long)(uVar10 + 8) < lVar1) {
      lVar12 = lVar1;
    }
    memset(pMVar6 + uVar10 * 8,0,(~uVar10 + lVar12 & 0xfffffffffffffff8) * 8 + 0x40);
    pMVar6 = local_510;
  }
  if (lVar1 < (long)uVar7) {
    memset(pMVar6 + uVar10 * 8 + ((long)uVar11 >> 3) * 0x40,0,((long)uVar14 % 8) * 8);
  }
  pCVar5 = local_4f8;
  uVar7 = local_500;
  iVar4 = local_508._0_4_;
  if ((local_4f8->super_ChLinkMateGeneric).mask.nconstr <= local_508._0_4_) goto LAB_005c1be6;
  (**(code **)((long)((local_4f8->super_ChLinkMateGeneric).mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_500]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x88))(&local_530);
  if ((long)local_520 < 6) goto LAB_005c1c08;
  uVar10 = 3;
  pMVar6 = local_530 + 0x18;
  if (((ulong)pMVar6 & 7) == 0) {
    uVar8 = -((uint)((ulong)pMVar6 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 3) {
      uVar10 = (ulong)uVar8;
    }
    if (uVar8 != 0) goto LAB_005c1b0e;
  }
  else {
LAB_005c1b0e:
    uVar11 = 0;
    do {
      *(double *)(pMVar6 + uVar11 * 8) =
           local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar11 + 6];
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if (uVar10 < 3) {
    do {
      *(double *)(pMVar6 + uVar10 * 8) =
           local_458.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar10 + 6];
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
  }
  if ((pCVar5->super_ChLinkMateGeneric).mask.nconstr <= iVar4) {
LAB_005c1be6:
    __assert_fail("(i >= 0) && (i < nconstr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                  ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
  }
  (**(code **)((long)((pCVar5->super_ChLinkMateGeneric).mask.constraints.
                      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
                     super_ChConstraint._vptr_ChConstraint + 0x90))(&local_530);
  if ((long)local_520 < 6) {
LAB_005c1c08:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  uVar7 = 3;
  local_530 = local_530 + 0x18;
  if (((ulong)local_530 & 7) == 0) {
    uVar8 = -((uint)((ulong)local_530 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar8 < 3) {
      uVar7 = (ulong)uVar8;
    }
    if (uVar8 == 0) goto LAB_005c1bb4;
  }
  uVar10 = 0;
  do {
    *(double *)(local_530 + uVar10 * 8) =
         local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         [uVar10 + 6];
    uVar10 = uVar10 + 1;
  } while (uVar7 != uVar10);
LAB_005c1bb4:
  if (uVar7 < 3) {
    do {
      *(double *)(local_530 + uVar7 * 8) =
           local_4a8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
           [uVar7 + 6];
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
  }
  return;
}

Assistant:

void ChLinkMotionImposed::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMateGeneric::Update(mytime, update_assets);

    // Override the rotational jacobian [Cq] and the rotational residual C,
    // by assuming an additional hidden frame that rotates about frame2:

    if (this->Body1 && this->Body2) {
        ChFrame<> frame1W = this->frame1 >> (*this->Body1);
        ChFrame<> frame2W = this->frame2 >> (*this->Body2);

		frameM2.SetRot(rotation_function->Get_q(mytime));
		frameM2.SetPos(position_function->Get_p(mytime));
		
		frameMb2 = frameM2 >> this->frame2;

		ChFrame<> frameMW = frameM2 >> frame2W;

        ChFrame<> frame1M;
        frameMW.TransformParentToLocal(frame1W, frame1M);

        ChMatrix33<> planeMW = frameMW.GetA();

        ChMatrix33<> Jw1 = planeMW.transpose() * Body1->GetA();
        ChMatrix33<> Jw2 = -planeMW.transpose() * Body2->GetA();

		ChMatrix33<> Jx1 = planeMW.transpose();
        ChMatrix33<> Jx2 = -planeMW.transpose();

        ChMatrix33<> Jr1 = -Jw1 * ChStarMatrix33<>(frame1.GetPos());
        ChMatrix33<> Jr2 = -Jw2 * ChStarMatrix33<>(frameMb2.GetPos());

		//???? not needed, because frame1W and frameRW should always coincide when x y z translations are constrained
        //ChVector<> p2p1_base2 = Body2->GetA().transpose() * (p1_abs - p2_abs); 
        //Jr2 += frame2.GetA().transpose() * ChStarMatrix33<>(p2p1_base2);

        // Premultiply by Jw1 and Jw2 by  0.5*[Fp(q_resid)]' to get residual as imaginary part of a quaternion.
        ChStarMatrix33<> mtempM(frame1M.GetRot().GetVector() * 0.5);
        mtempM(0, 0) = 0.5 * frame1M.GetRot().e0();
        mtempM(1, 1) = 0.5 * frame1M.GetRot().e0();
        mtempM(2, 2) = 0.5 * frame1M.GetRot().e0();

        ChMatrix33<> mtempQ;
        mtempQ = mtempM.transpose() * Jw1;
        Jw1 = mtempQ;
        mtempQ = mtempM.transpose() * Jw2;
        Jw2 = mtempQ;

        int nc = 0;

        if (c_x) {
            C(nc) = frame1M.GetPos().x();
            mask.Constr_N(nc).Get_Cq_a().segment(0, 3) = Jx1.row(0);
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jr1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(0, 3) = Jx2.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jr2.row(0);
            nc++;
        }
        if (c_y) {
            C(nc) = frame1M.GetPos().y();
            mask.Constr_N(nc).Get_Cq_a().segment(0, 3) = Jx1.row(1);
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jr1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(0, 3) = Jx2.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jr2.row(1);
            nc++;
        }
        if (c_z) {
            C(nc) = frame1M.GetPos().z();
            mask.Constr_N(nc).Get_Cq_a().segment(0, 3) = Jx1.row(2);
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jr1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(0, 3) = Jx2.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jr2.row(2);
            nc++;
        }
        if (c_rx) {
            C(nc) = frame1M.GetRot().e1();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(0);
            nc++;
        }
        if (c_ry) {
            C(nc) = frame1M.GetRot().e2();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(1);
            nc++;
        }
        if (c_rz) {
            C(nc) = frame1M.GetRot().e3();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(2);
            nc++;
        }
    }
}